

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O2

void __thiscall indk::Neuron::Entry::~Entry(Entry *this)

{
  pointer ppSVar1;
  Synapse *pSVar2;
  vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_> *__range1;
  pointer ppSVar3;
  
  ppSVar1 = (this->Synapses).
            super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar3 = (this->Synapses).
                 super__Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar1;
      ppSVar3 = ppSVar3 + 1) {
    pSVar2 = *ppSVar3;
    if (pSVar2 != (Synapse *)0x0) {
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&(pSVar2->GammaQ).super__Vector_base<float,_std::allocator<float>_>);
    }
    operator_delete(pSVar2,0x60);
  }
  std::_Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>::
  ~_Vector_base((_Vector_base<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_> *)
                this);
  return;
}

Assistant:

indk::Neuron::Entry::~Entry() {
    for (auto S: Synapses) delete S;
}